

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

QList<QDockWidget_*> * __thiscall
QMainWindowLayout::tabifiedDockWidgets
          (QList<QDockWidget_*> *__return_storage_ptr__,QMainWindowLayout *this,
          QDockWidget *dockWidget)

{
  QMainWindowTabBar *this_00;
  long in_FS_OFFSET;
  QDockWidget *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = dockWidget;
  this_00 = findTabBar(this,dockWidget);
  if (this_00 == (QMainWindowTabBar *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_10) goto LAB_0043bfb1;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QDockWidget **)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (QDockWidget **)&DAT_aaaaaaaaaaaaaaaa;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
LAB_0043bfb1:
      __stack_chk_fail();
    }
    QMainWindowTabBar::dockWidgets(__return_storage_ptr__,(QMainWindowTabBar *)this_00);
    QtPrivate::sequential_erase_one<QList<QDockWidget*>,QDockWidget_const*>
              (__return_storage_ptr__,&local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QDockWidget *> QMainWindowLayout::tabifiedDockWidgets(const QDockWidget *dockWidget) const
{
    const auto *bar = findTabBar(dockWidget);
    if (!bar)
        return {};

    QList<QDockWidget *> buddies = bar->dockWidgets();
    // Return only other dock widgets associated with dockWidget in a tab bar.
    // If dockWidget is alone in a tab bar, return an empty list.
    buddies.removeOne(dockWidget);
    return buddies;
}